

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radial_factory.hpp
# Opt level: O2

RadialQuad IntegratorXX::radial_from_string(string *name)

{
  pointer pcVar1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  runtime_error *this;
  RadialQuad RVar5;
  size_type sVar6;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  sVar2 = name->_M_string_length;
  for (sVar6 = 0; sVar2 != sVar6; sVar6 = sVar6 + 1) {
    iVar4 = toupper((int)pcVar1[sVar6]);
    pcVar1[sVar6] = (char)iVar4;
  }
  bVar3 = std::operator==(name,"BECKE");
  if (bVar3) {
    RVar5 = Becke;
  }
  else {
    bVar3 = std::operator==(name,"MURAKNOWLES");
    RVar5 = MuraKnowles;
    if (!bVar3) {
      bVar3 = std::operator==(name,"MK");
      if (!bVar3) {
        bVar3 = std::operator==(name,"MURRAYHANDYLAMING");
        RVar5 = MurrayHandyLaming;
        if (!bVar3) {
          bVar3 = std::operator==(name,"MHL");
          if (!bVar3) {
            bVar3 = std::operator==(name,"TREUTLERAHLRICHS");
            RVar5 = TreutlerAhlrichs;
            if (!bVar3) {
              bVar3 = std::operator==(name,"TA");
              if (!bVar3) {
                this = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(this,"Unrecognized Radial Quadrature");
                __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
              }
            }
          }
        }
      }
    }
  }
  return RVar5;
}

Assistant:

RadialQuad radial_from_string(std::string name) {
  std::transform(name.begin(), name.end(), name.begin(), ::toupper);
  if(name == "BECKE")             return RadialQuad::Becke;
  if(name == "MURAKNOWLES")       return RadialQuad::MuraKnowles;
  if(name == "MK")                return RadialQuad::MuraKnowles;
  if(name == "MURRAYHANDYLAMING") return RadialQuad::MurrayHandyLaming;
  if(name == "MHL")               return RadialQuad::MurrayHandyLaming;
  if(name == "TREUTLERAHLRICHS")  return RadialQuad::TreutlerAhlrichs;
  if(name == "TA")                return RadialQuad::TreutlerAhlrichs;

  throw std::runtime_error("Unrecognized Radial Quadrature");
}